

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O0

void changeLibPathsOnFile(string *file_to_fix)

{
  bool bVar1;
  iterator this;
  iterator __k;
  ostream *poVar2;
  char *pcVar3;
  size_type sVar4;
  vector<Dependency,_std::allocator<Dependency>_> *in_RDI;
  vector<Dependency,_std::allocator<Dependency>_> *unaff_retaddr;
  int n;
  int dep_amount;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  string *in_stack_000000b8;
  Dependency *in_stack_000000c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffffa8;
  vector<Dependency,_std::allocator<Dependency>_> *in_stack_ffffffffffffffc0;
  int local_38;
  vector<Dependency,_std::allocator<Dependency>_> local_30;
  
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x10a0ad);
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==((_Self *)&stack0xfffffffffffffff0,(_Self *)&stack0xffffffffffffffe8);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"    ");
    collectDependencies(file_to_fix);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  * Fixing dependencies on ");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
                *)this._M_node,(key_type *)__k._M_node);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector(unaff_retaddr,in_RDI);
  sVar4 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&local_30);
  for (local_38 = 0; local_38 < (int)sVar4; local_38 = local_38 + 1) {
    std::vector<Dependency,_std::allocator<Dependency>_>::operator[](&local_30,(long)local_38);
    Dependency::fixFileThatDependsOnMe(in_stack_000000c0,in_stack_000000b8);
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void changeLibPathsOnFile(std::string file_to_fix)
{
    if (deps_collected.find(file_to_fix) == deps_collected.end())
    {
        std::cout << "    ";
        collectDependencies(file_to_fix);
        std::cout << "\n";
    }
    std::cout << "  * Fixing dependencies on " << file_to_fix.c_str() << std::endl;
    
    std::vector<Dependency> deps_in_file = deps_per_file[file_to_fix];
    const int dep_amount = deps_in_file.size();
    for(int n=0; n<dep_amount; n++)
    {
        deps_in_file[n].fixFileThatDependsOnMe(file_to_fix);
    }
}